

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_value.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_25/FSMaxB[P]cJSON/tests/print_value.c"
            );
  UnityDefaultTestRun(print_value_should_print_null,"print_value_should_print_null",0x62);
  UnityDefaultTestRun(print_value_should_print_true,"print_value_should_print_true",99);
  UnityDefaultTestRun(print_value_should_print_false,"print_value_should_print_false",100);
  UnityDefaultTestRun(print_value_should_print_number,"print_value_should_print_number",0x65);
  UnityDefaultTestRun(print_value_should_print_string,"print_value_should_print_string",0x66);
  UnityDefaultTestRun(print_value_should_print_array,"print_value_should_print_array",0x67);
  UnityDefaultTestRun(print_value_should_print_object,"print_value_should_print_object",0x68);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    /* initialize cJSON item */
    UNITY_BEGIN();

    RUN_TEST(print_value_should_print_null);
    RUN_TEST(print_value_should_print_true);
    RUN_TEST(print_value_should_print_false);
    RUN_TEST(print_value_should_print_number);
    RUN_TEST(print_value_should_print_string);
    RUN_TEST(print_value_should_print_array);
    RUN_TEST(print_value_should_print_object);

    return UNITY_END();
}